

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc.c
# Opt level: O2

void sysbvm_gc_safepoint(sysbvm_context_t *context)

{
  ulong *puVar1;
  uint uVar2;
  ulong in_RAX;
  ulong type;
  size_t sVar3;
  uint uVar4;
  ulong immediateTypeTag;
  sysbvm_tuple_t *pointerAddress;
  long in_FS_OFFSET;
  bool bVar5;
  ulong local_38;
  
  if (((*(int *)(in_FS_OFFSET + -0x20) != 0) || ((context->heap).shouldAttemptToCollect != true)) ||
     (context->gcDisabled != false)) {
    return;
  }
  local_38 = in_RAX;
  sysbvm_gc_iterateRoots(context,context,sysbvm_gc_markPointer);
  do {
    sVar3 = (context->markingStack).size;
    if (sVar3 == 0) {
      sysbvm_heap_replaceWeakReferencesWithTombstones(&context->heap);
      sysbvm_heap_sweep(&context->heap);
      sysbvm_heap_swapGCColors(&context->heap);
      return;
    }
    (context->markingStack).size = sVar3 - 1;
    puVar1 = *(ulong **)((context->markingStack).data + sVar3 * 8 + -8);
    immediateTypeTag = (ulong)puVar1 & 0xf;
    if (immediateTypeTag != 0 || puVar1 == (ulong *)0x0) {
      if ((int)immediateTypeTag == 0xf) {
        type = sysbvm_tuple_getImmediateTrivialTypeWithIndex(context,(ulong)puVar1 >> 4);
      }
      else {
        type = sysbvm_tuple_getImmediateTypeWithTag(context,immediateTypeTag);
      }
    }
    else {
      type = *puVar1;
    }
    local_38 = type;
    sysbvm_gc_markPointer(context,&local_38);
    if (immediateTypeTag != 0 || puVar1 == (ulong *)0x0) {
LAB_00111abd:
      sVar3 = 0;
LAB_00111ac0:
      pointerAddress = puVar1 + 2;
      while (bVar5 = sVar3 != 0, sVar3 = sVar3 - 1, bVar5) {
        sysbvm_gc_markPointer(context,pointerAddress);
        pointerAddress = pointerAddress + 1;
      }
      uVar2 = (uint)puVar1[1];
    }
    else {
      uVar2 = (uint)puVar1[1];
      uVar4 = uVar2 >> 8 & 3;
      if (uVar4 != 2) {
        if (uVar4 == 1) {
          if ((type & 0xf) != 0 || type == 0) goto LAB_00111abd;
          sVar3 = sysbvm_type_getTotalSlotCount(type);
        }
        else {
          sVar3 = (size_t)(*(uint *)((long)puVar1 + 0xc) >> 3);
        }
        goto LAB_00111ac0;
      }
    }
    *(uint *)(puVar1 + 1) = uVar2 & 0xfffffffc | (context->heap).gcBlackColor;
  } while( true );
}

Assistant:

SYSBVM_API void sysbvm_gc_safepoint(sysbvm_context_t *context)
{
    if(sysbvm_gc_perThreadLockCount != 0)
        return;

    // Check the attempt collection flag on the heap.
    if(!context->heap.shouldAttemptToCollect || context->gcDisabled)
        return;

    // TODO: Add Support for multiple threads.

    // Hook location for validating GC stack roots via GDB scripting.
    sysbvm_gc_debugStackValidationHook();
    sysbvm_gc_performCycle(context);
}